

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_vector *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  _Base_ptr __lhs;
  UsdPrimvarReader_vector *prop;
  _Base_ptr *this;
  undefined8 uVar1;
  pointer pSVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  value_type *pvVar6;
  long lVar7;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar9;
  value_type *value;
  ostream *poVar10;
  size_type sVar11;
  mapped_type *this_00;
  _Base_ptr p_Var12;
  UsdPrimvarReader_vector *args;
  long lVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  Property *args_1;
  Property *this_01;
  Property *args_2;
  UsdPrimvarReader_vector *pUStackY_600;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa08;
  ParseResult ret;
  optional<tinyusdz::value::vector3f> local_5a8;
  AttrMetas *local_598;
  double local_590;
  _Base_ptr local_588;
  undefined1 local_580 [40];
  Property *local_558;
  _Base_ptr local_550;
  optional<tinyusdz::value::vector3f> pv;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e_1;
  undefined1 local_4a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490 [22];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310 [32];
  optional<tinyusdz::Animatable<tinyusdz::value::vector3f>_> av;
  string local_70 [32];
  string local_50;
  UsdPrimvarReader_vector *pUVar8;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args = preader;
  args_1 = (Property *)warn;
  args_2 = (Property *)err;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&av,"info:id",(allocator *)&ss_e_1);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&av);
  ::std::__cxx11::string::_M_dispose();
  local_550 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_598 = &(preader->fallback)._metas;
  local_558 = (Property *)&preader->varname;
  local_580._32_8_ = &preader->result;
  for (p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var12 != local_550;
      p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12)) {
    __lhs = p_Var12 + 1;
    ::std::__cxx11::string::string((string *)&local_330,(string *)__lhs);
    prop = (UsdPrimvarReader_vector *)(p_Var12 + 2);
    ::std::__cxx11::string::string
              ((string *)local_580,"inputs:fallback",(allocator *)&stack0xfffffffffffffa0f);
    ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
    ret.err._M_string_length = 0;
    ret.err.field_2._M_local_buf[0] = '\0';
    iVar5 = ::std::__cxx11::string::compare((string *)&local_330);
    local_588 = p_Var12;
    if (iVar5 == 0) {
      if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
        ret.code = PropertyTypeMismatch;
        ::std::__cxx11::string::string
                  ((string *)&ss_e_1,
                   "Property `{}` must be Attribute, but declared as Relationship.",
                   (allocator *)&attr_type_name);
        fmt::format<std::__cxx11::string>
                  ((string *)&av,(fmt *)&ss_e_1,(string *)local_580,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&av);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      if (p_Var12[6]._M_left != p_Var12[6]._M_parent) {
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(preader->fallback)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var12[6]._M_parent)
        ;
        ret.code = Success;
      }
      Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)prop);
      tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&av,&attr_type_name);
      if (_Var4) {
        ::std::__cxx11::string::_M_dispose();
LAB_001decf1:
        iVar5 = *(int *)((long)&p_Var12[0x17]._M_parent + 4);
        if (iVar5 == 1) {
          bVar3 = Attribute::is_blocked((Attribute *)prop);
          if (bVar3) {
            (preader->fallback)._blocked = true;
          }
          this = &p_Var12[4]._M_parent;
          bVar3 = primvar::PrimVar::has_value((PrimVar *)this);
          if ((bVar3) || (p_Var12[5]._M_left != p_Var12[5]._M_parent)) {
            av.contained._24_1_ = 0;
            av.contained._25_8_ = 0;
            av.contained._8_8_ = 0;
            av.contained._16_1_ = 0;
            av.contained._17_7_ = 0;
            av.contained._0_4_ = 0;
            av.contained._4_2_ = 0;
            av.has_value_ = false;
            av._1_5_ = 0;
            av._6_2_ = 0;
            bVar3 = primvar::PrimVar::is_valid((PrimVar *)this);
            if (bVar3) {
              bVar3 = primvar::PrimVar::has_value((PrimVar *)this);
              if (bVar3) {
                primvar::PrimVar::get_value<tinyusdz::value::vector3f>(&local_5a8,(PrimVar *)this);
                pv.has_value_ = local_5a8.has_value_;
                if (local_5a8.has_value_ != true) goto LAB_001def5e;
                pv.contained._8_4_ = local_5a8.contained._8_4_;
                pv.contained._0_8_ = local_5a8.contained._0_8_;
                pvVar6 = nonstd::optional_lite::optional<tinyusdz::value::vector3f>::value(&pv);
                uVar1._0_4_ = pvVar6->x;
                uVar1._4_4_ = pvVar6->y;
                av.has_value_ = SUB41((undefined4)uVar1,0);
                av._1_5_ = SUB85((ulong)uVar1 >> 8,0);
                av._6_2_ = SUB42((uint)uVar1._4_4_ >> 0x10,0);
                av.contained._0_4_ = pvVar6->z;
                av.contained._4_2_ = 1;
                args = (UsdPrimvarReader_vector *)p_Var12[5]._M_parent;
                pUVar8 = (UsdPrimvarReader_vector *)p_Var12[5]._M_left;
                pUStackY_600 = args;
                if (pUVar8 != args) goto LAB_001def77;
              }
              else {
LAB_001def5e:
                args = (UsdPrimvarReader_vector *)p_Var12[5]._M_parent;
                pUVar8 = (UsdPrimvarReader_vector *)p_Var12[5]._M_left;
                if (pUVar8 == args) goto LAB_001df054;
LAB_001def77:
                lVar13 = 0;
                uVar14 = 0;
                while( true ) {
                  lVar7 = (long)pUVar8 - (long)args;
                  pUStackY_600 = (UsdPrimvarReader_vector *)0x28;
                  args = (UsdPrimvarReader_vector *)0x28;
                  if ((ulong)(lVar7 / 0x28) <= uVar14) break;
                  pvVar9 = tinyusdz::value::TimeSamples::get_samples
                                     ((TimeSamples *)&p_Var12[5]._M_parent);
                  pSVar2 = (pvVar9->
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if ((&pSVar2->blocked)[lVar13] == true) {
                    TypedTimeSamples<tinyusdz::value::vector3f>::add_blocked_sample
                              ((TypedTimeSamples<tinyusdz::value::vector3f> *)
                               ((long)&av.contained + 8),*(double *)((long)&pSVar2->t + lVar13));
                  }
                  else {
                    tinyusdz::value::Value::get_value<tinyusdz::value::vector3f>
                              (&local_5a8,(Value *)((long)&(pSVar2->value).v_.storage + lVar13),
                               false);
                    pv.has_value_ = local_5a8.has_value_;
                    if (local_5a8.has_value_ != true) {
                      _ss_e_1 = _ss_e_1 & 0xffffff00;
                      local_490[1]._0_8_ = 0;
                      local_490[1]._8_8_ = 0;
                      local_490[0]._0_8_ = 0;
                      local_490[0]._8_8_ = 0;
                      local_4a0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                      local_4a0._8_8_ = 0;
                      goto LAB_001df076;
                    }
                    pv.contained._8_4_ = local_5a8.contained._8_4_;
                    pv.contained._0_8_ = local_5a8.contained._0_8_;
                    local_590 = *(double *)((long)&pSVar2->t + lVar13);
                    pvVar6 = nonstd::optional_lite::optional<tinyusdz::value::vector3f>::value(&pv);
                    TypedTimeSamples<tinyusdz::value::vector3f>::add_sample
                              ((TypedTimeSamples<tinyusdz::value::vector3f> *)
                               ((long)&av.contained + 8),local_590,pvVar6);
                  }
                  uVar14 = uVar14 + 1;
                  args = (UsdPrimvarReader_vector *)p_Var12[5]._M_parent;
                  pUVar8 = (UsdPrimvarReader_vector *)p_Var12[5]._M_left;
                  lVar13 = lVar13 + 0x28;
                }
              }
              args = pUStackY_600;
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::vector3f>_>::
              optional<tinyusdz::Animatable<tinyusdz::value::vector3f>,_0>
                        ((optional<tinyusdz::Animatable<tinyusdz::value::vector3f>_> *)&ss_e_1,
                         (Animatable<tinyusdz::value::vector3f> *)&av);
            }
            else {
LAB_001df054:
              _ss_e_1 = _ss_e_1 & 0xffffff00;
              local_490[1]._0_8_ = 0;
              local_490[1]._8_8_ = 0;
              local_490[0]._0_8_ = 0;
              local_490[0]._8_8_ = 0;
              local_4a0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_4a0._8_8_ = 0;
            }
LAB_001df076:
            ::std::
            _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample>_>
            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::vector3f>::Sample>_>
                             *)((long)&av.contained + 8));
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::vector3f>_>::
            optional<tinyusdz::Animatable<tinyusdz::value::vector3f>,_0>
                      (&av,(optional<tinyusdz::Animatable<tinyusdz::value::vector3f>_> *)&ss_e_1);
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::vector3f>_>::
            ~optional((optional<tinyusdz::Animatable<tinyusdz::value::vector3f>_> *)&ss_e_1);
            bVar3 = av.has_value_;
            if (av.has_value_ == true) {
              value = nonstd::optional_lite::
                      optional<tinyusdz::Animatable<tinyusdz::value::vector3f>_>::value(&av);
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::vector3f>>::
              operator=((optional<tinyusdz::Animatable<tinyusdz::value::vector3f>> *)
                        &(preader->fallback)._attrib,value);
            }
            else {
              ret.code = InternalError;
              ::std::__cxx11::string::assign((char *)&ret.err);
            }
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::vector3f>_>::
            ~optional(&av);
            if (bVar3 == false) goto LAB_001df10b;
            AttrMetas::operator=(local_598,(AttrMetas *)(p_Var12 + 7));
            goto LAB_001df0fb;
          }
          if (p_Var12[6]._M_left == p_Var12[6]._M_parent) goto LAB_001df10b;
          AttrMetas::operator=(local_598,(AttrMetas *)(p_Var12 + 7));
          __v = &local_330;
        }
        else {
          if (iVar5 != 0) {
            ::std::__cxx11::string::assign((char *)&ret.err);
            ret.code = InternalError;
            goto LAB_001df10b;
          }
          (preader->fallback)._value_empty = true;
          AttrMetas::operator=(local_598,(AttrMetas *)(p_Var12 + 7));
LAB_001df0fb:
          __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580;
        }
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,__v);
        ret.code = Success;
      }
      else {
        tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e_1,&attr_type_name);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (_Var4) goto LAB_001decf1;
        ret.code = TypeMismatch;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&av);
        poVar10 = ::std::operator<<((ostream *)((long)&av.contained + 8),"Property type mismatch. ")
        ;
        poVar10 = ::std::operator<<(poVar10,(string *)local_580);
        poVar10 = ::std::operator<<(poVar10," expects type `");
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
        poVar10 = ::std::operator<<(poVar10,(string *)&ss_e_1);
        poVar10 = ::std::operator<<(poVar10,"` but defined as type `");
        poVar10 = ::std::operator<<(poVar10,(string *)&attr_type_name);
        ::std::operator<<(poVar10,"`");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e_1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&av);
      }
LAB_001df10b:
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ret.code = Unmatched;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar5 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      bVar3 = false;
      iVar5 = 3;
    }
    else {
      bVar3 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar10 = ::std::operator<<((ostream *)&av,"[error]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
        poVar10 = ::std::operator<<(poVar10,"():");
        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1162);
        ::std::operator<<(poVar10," ");
        ::std::__cxx11::string::string
                  ((string *)&attr_type_name,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)local_580);
        args = (UsdPrimvarReader_vector *)&ret.err;
        fmt::format<char[16],std::__cxx11::string>
                  ((string *)&ss_e_1,(fmt *)&attr_type_name,(string *)"inputs:fallback",
                   (char (*) [16])args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar10 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&attr_type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
        bVar3 = false;
        iVar5 = 1;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    this_01 = (Property *)&av;
    if (bVar3) {
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"inputs:varname");
      if (bVar3) {
        ::std::__cxx11::string::string((string *)this_01,"inputs:varname",(allocator *)&ss_e_1);
        sVar11 = ::std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&table,(key_type *)this_01);
        ::std::__cxx11::string::_M_dispose();
        if (sVar11 == 0) {
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)this_01);
          ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
          ::std::__cxx11::string::string
                    ((string *)&ss_e_1,"inputs:varname",(allocator *)&attr_type_name);
          args = prop;
          args_1 = (Property *)&ss_e_1;
          args_2 = this_01;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    (&ret,&table,&local_50,(Property *)prop,(string *)&ss_e_1,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)this_01);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (ret.code == TypeMismatch) {
            ::std::__cxx11::string::string(local_70,(string *)__lhs);
            ::std::__cxx11::string::string
                      ((string *)&ss_e_1,"inputs:varname",(allocator *)local_580);
            args = prop;
            args_1 = (Property *)&ss_e_1;
            args_2 = local_558;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)&attr_type_name,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(string *)prop,(Property *)&ss_e_1,(string *)local_558,
                       in_stack_fffffffffffffa08);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar5 = 3;
            if ((int)attr_type_name._M_dataplus._M_p != 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              poVar10 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x117b);
              ::std::operator<<(poVar10," ");
              ::std::__cxx11::string::string
                        ((string *)&pv,"Faied to parse inputs:varname: {}",(allocator *)&local_5a8);
              fmt::format<std::__cxx11::string>
                        ((string *)local_580,(fmt *)&pv,(string *)&attr_type_name._M_string_length,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar10 = ::std::operator<<((ostream *)&ss_e_1,(string *)local_580);
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((string *)local_580,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)err);
                ::std::__cxx11::string::operator=((string *)err,(string *)local_580);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
              iVar5 = 1;
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            iVar5 = 0;
            if (ret.code == Success) {
              bVar3 = ConvertTokenAttributeToStringAttribute
                                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)this_01,
                                 (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_558);
              iVar5 = 3;
              if (!bVar3) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
                poVar10 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1169);
                ::std::operator<<(poVar10," ");
                poVar10 = ::std::operator<<((ostream *)&ss_e_1,
                                            "Failed to convert inputs:varname token type to string type."
                                           );
                ::std::operator<<(poVar10,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&attr_type_name,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_580,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
                  ::std::__cxx11::string::operator=((string *)err,(string *)&attr_type_name);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
                iVar5 = 1;
              }
            }
          }
          ::std::__cxx11::string::_M_dispose();
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)this_01);
          if (iVar5 != 0) goto LAB_001df9fe;
        }
      }
      ::std::__cxx11::string::string(local_310,(string *)__lhs);
      ::std::__cxx11::string::string
                ((string *)&pv,"outputs:result",(allocator *)&stack0xfffffffffffffa0f);
      local_4a0._0_8_ = local_490;
      local_4a0._8_8_ = 0;
      local_490[0]._0_8_ = local_490[0]._0_8_ & 0xffffffffffffff00;
      iVar5 = ::std::__cxx11::string::compare(local_310);
      if (iVar5 == 0) {
        sVar11 = ::std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&table,(key_type *)&pv);
        if (sVar11 == 0) {
          bVar3 = Property::is_attribute_connection((Property *)prop);
          p_Var12 = local_588;
          if (bVar3) {
            _ss_e_1 = 5;
            ::std::__cxx11::string::assign(local_4a0);
          }
          else if (*(int *)((long)&local_588[0x17]._M_parent + 4) == 0) {
            Attribute::type_name_abi_cxx11_((string *)this_01,(Attribute *)prop);
            bVar3 = tinyusdz::value::IsRoleType((string *)this_01);
            local_590 = (double)CONCAT71(local_590._1_7_,bVar3);
            tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
            _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)this_01);
            ::std::__cxx11::string::_M_dispose();
            if (_Var4) {
              (preader->result)._authored = true;
LAB_001dfae4:
              AttrMetas::operator=((AttrMetas *)local_580._32_8_,(AttrMetas *)(p_Var12 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pv);
              _ss_e_1 = 0;
              this_01 = args_1;
            }
            else {
              if (local_590._0_1_ == '\0') {
                tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
                _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&ret,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this_01);
                ::std::__cxx11::string::_M_dispose();
                if (_Var4) {
                  (preader->result)._authored = true;
                  ::std::__cxx11::string::_M_assign((string *)&(preader->result)._actual_type_name);
                  goto LAB_001dfae4;
                }
                _ss_e_1 = 3;
                ::std::__cxx11::string::string
                          ((string *)&attr_type_name,
                           "Attribute type mismatch. {} expects type `{}`(and its underlying types) but defined as type `{}`."
                           ,(allocator *)&local_5a8);
                args = (UsdPrimvarReader_vector *)local_580;
                tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)&ret,(fmt *)&attr_type_name,(string *)&pv,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)args_2);
                ::std::__cxx11::string::operator=((string *)local_4a0,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
              }
              else {
                _ss_e_1 = 3;
                ::std::__cxx11::string::string
                          ((string *)&attr_type_name,
                           "Attribute type mismatch. {} expects type `{}` but defined as type `{}`."
                           ,(allocator *)&local_5a8);
                args = (UsdPrimvarReader_vector *)local_580;
                tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)&ret,(fmt *)&attr_type_name,(string *)&pv,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)args_2);
                ::std::__cxx11::string::operator=((string *)local_4a0,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::string::_M_dispose();
            args_1 = this_01;
          }
          else {
            ::std::__cxx11::string::assign(local_4a0);
            _ss_e_1 = 6;
          }
        }
        else {
          _ss_e_1 = 2;
        }
      }
      else {
        _ss_e_1 = 1;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar5 = 0;
      if ((_ss_e_1 & 0xfffffffd) == 0) {
        iVar5 = 3;
LAB_001df4df:
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if (_ss_e_1 != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
          poVar10 = ::std::operator<<((ostream *)&av,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
          poVar10 = ::std::operator<<(poVar10,"():");
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1181);
          ::std::operator<<(poVar10," ");
          ::std::__cxx11::string::string
                    ((string *)&attr_type_name,
                     "Parsing shader output property `{}` failed. Error: {}",(allocator *)local_580)
          ;
          args = (UsdPrimvarReader_vector *)local_4a0;
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&attr_type_name,(string *)"outputs:result",
                     (char (*) [15])args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar10 = ::std::operator<<((ostream *)&av,(string *)&ret);
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&attr_type_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
          iVar5 = 1;
          goto LAB_001df4df;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) goto LAB_001df9fe;
      sVar11 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)__lhs);
      if (sVar11 == 0) {
        this_00 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[](&(preader->super_ShaderNode).super_UsdShadePrim.props,
                               (key_type *)__lhs);
        Property::operator=(this_00,(Property *)prop);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
      }
      sVar11 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)__lhs);
      p_Var12 = local_588;
      if (sVar11 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar10 = ::std::operator<<((ostream *)&av,"[warn]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
        poVar10 = ::std::operator<<(poVar10,"():");
        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1183);
        ::std::operator<<(poVar10," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &ss_e_1,"Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
        ;
        poVar10 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        if (warn != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)warn,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
      }
    }
    else {
LAB_001df9fe:
      p_Var12 = local_588;
      if ((iVar5 != 3) && (iVar5 != 0)) break;
    }
  }
  bVar3 = p_Var12 == local_550;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar3;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_vector>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_vector *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_vector,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_vector, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_vector, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}